

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

PinState __thiscall HWISim::DigitalRead(HWISim *this,Pin pin)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  key_type local_14;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DR ",3);
  pmVar1 = std::__detail::
           _Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinNames_abi_cxx11_,&local_14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar1->_M_dataplus)._M_p,pmVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," returning HOME_INACTIVE",0x18);
  return HOME_INACTIVE;
}

Assistant:

PinState DigitalRead( Pin pin ) override
  {
    std::cout << "DR " << HWI::pinNames.at(pin) << " returning HOME_INACTIVE";
    return HWI::PinState::HOME_INACTIVE;
  }